

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

void print_type(CrispyValue value)

{
  ulong uVar1;
  
  switch(value.type) {
  case NIL:
    puts(" : NIL");
    return;
  case NUMBER:
    puts(" : NUMBER");
    return;
  case OBJECT:
    break;
  case BOOLEAN:
    puts(" : BOOLEAN");
    return;
  default:
    return;
  }
  uVar1 = (ulong)(value.field_1.o_value)->type;
  if (3 < uVar1) {
    puts(" : OBJECT");
    return;
  }
  puts((&PTR_s___STRING_0010cdb8)[uVar1]);
  return;
}

Assistant:

void print_type(CrispyValue value) {
    switch (value.type) {
        case NUMBER:
            printf(" : NUMBER\n");
            break;
        case BOOLEAN:
            printf(" : BOOLEAN\n");
            break;
        case OBJECT:
            print_object_type(value);
            break;
        case NIL:
            printf(" : NIL\n");
            break;
    }
}